

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

int __thiscall SightCheck::P_SightBlockLinesIterator(SightCheck *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FPortalBlock *pFVar4;
  line_t_conflict **pplVar5;
  byte local_51;
  byte local_45;
  uint local_44;
  polyblock_t *ppStack_40;
  uint i;
  polyblock_t *polyLink;
  int *piStack_30;
  int res;
  int *list;
  int offset;
  int y_local;
  int x_local;
  SightCheck *this_local;
  
  polyLink._4_4_ = 1;
  iVar2 = y * bmapwidth + x;
  local_45 = 1;
  if ((this->portalfound & 1U) == 0) {
    pFVar4 = FPortalBlockmap::operator()(&PortalBlockmap,x,y);
    local_45 = pFVar4->containsLinkedPortals;
  }
  this->portalfound = (bool)(local_45 & 1);
  ppStack_40 = PolyBlockMap[iVar2];
  local_51 = 0;
  if (ppStack_40 != (polyblock_t *)0x0) {
    local_51 = PortalBlockmap.hasLinkedPolyPortals;
  }
  this->portalfound = (this->portalfound & 1U) != 0 || (local_51 & 1) != 0;
  for (; ppStack_40 != (polyblock_t *)0x0; ppStack_40 = ppStack_40->next) {
    if ((ppStack_40->polyobj != (FPolyObj *)0x0) && (ppStack_40->polyobj->validcount != validcount))
    {
      ppStack_40->polyobj->validcount = validcount;
      for (local_44 = 0; uVar3 = TArray<line_t_*,_line_t_*>::Size(&ppStack_40->polyobj->Linedefs),
          local_44 < uVar3; local_44 = local_44 + 1) {
        pplVar5 = TArray<line_t_*,_line_t_*>::operator[]
                            (&ppStack_40->polyobj->Linedefs,(ulong)local_44);
        bVar1 = P_SightCheckLine(this,*pplVar5);
        if (!bVar1) {
          if ((this->portalfound & 1U) == 0) {
            return 0;
          }
          polyLink._4_4_ = -1;
        }
      }
    }
  }
  piStack_30 = blockmaplump + blockmap[iVar2];
  while( true ) {
    do {
      piStack_30 = piStack_30 + 1;
      if (*piStack_30 == -1) {
        return polyLink._4_4_;
      }
      bVar1 = P_SightCheckLine(this,lines + *piStack_30);
    } while (bVar1);
    if ((this->portalfound & 1U) == 0) break;
    polyLink._4_4_ = -1;
  }
  return 0;
}

Assistant:

int SightCheck::P_SightBlockLinesIterator (int x, int y)
{
	int offset;
	int *list;
	int res = 1;

	polyblock_t *polyLink;
	unsigned int i;
	extern polyblock_t **PolyBlockMap;

	offset = y*bmapwidth+x;

	// if any of the previous blocks may contain a portal we may abort the collection of lines here, but we may not abort the sight check.
	// (We still try to delay activating this for as long as possible.)
	portalfound = portalfound || PortalBlockmap(x, y).containsLinkedPortals;

	polyLink = PolyBlockMap[offset];
	portalfound |= (polyLink && PortalBlockmap.hasLinkedPolyPortals);
	while (polyLink)
	{
		if (polyLink->polyobj)
		{ // only check non-empty links
			if (polyLink->polyobj->validcount != validcount)
			{
				polyLink->polyobj->validcount = validcount;
				for (i = 0; i < polyLink->polyobj->Linedefs.Size(); i++)
				{
					if (!P_SightCheckLine(polyLink->polyobj->Linedefs[i]))
					{
						if (!portalfound) return 0;
						else res = -1;
					}
				}
			}
		}
		polyLink = polyLink->next;
	}

	offset = *(blockmap + offset);

	for (list = blockmaplump + offset + 1; *list != -1; list++)
	{
		if (!P_SightCheckLine (&lines[*list]))
		{
			if (!portalfound) return 0;
			else res = -1;
		}
	}

	return res;			// everything was checked
}